

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strisalphanumeric_s.c
# Opt level: O3

_Bool strisalphanumeric_s(char *dest,rsize_t dmax)

{
  long lVar1;
  rsize_t rVar2;
  byte bVar3;
  errno_t error;
  _Bool _Var4;
  char *msg;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    msg = "strisalphanumeric_s: dest is null";
    error = 400;
  }
  else if (dmax == 0) {
    msg = "strisalphanumeric_s: dmax is 0";
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      bVar3 = *dest;
      if (bVar3 == 0) {
        _Var4 = false;
      }
      else {
        rVar2 = 1;
        do {
          bVar5 = (byte)(bVar3 - 0x30) < 10;
          bVar6 = (byte)((bVar3 & 0xdf) + 0xbf) < 0x1a;
          _Var4 = bVar6 || bVar5;
          if ((!bVar6 && !bVar5) || (dmax == rVar2)) break;
          bVar3 = dest[rVar2];
          rVar2 = rVar2 + 1;
        } while (bVar3 != 0);
      }
      goto LAB_00105603;
    }
    msg = "strisalphanumeric_s: dmax exceeds max";
    error = 0x193;
  }
  _Var4 = false;
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00105603:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return _Var4;
}

Assistant:

bool
strisalphanumeric_s (const char *dest, rsize_t dmax)
{
    if (!dest) {
        invoke_safe_str_constraint_handler("strisalphanumeric_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strisalphanumeric_s: "
                   "dmax is 0",
                   NULL, ESZEROL);
        return (false);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strisalphanumeric_s: "
                   "dmax exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    while (dmax && *dest) {

        if (( (*dest >= '0') && (*dest <= '9') )  ||
            ( (*dest >= 'a') && (*dest <= 'z') )  ||
            ( (*dest >= 'A') && (*dest <= 'Z') )) {
            dest++;
            dmax--;
        } else {
            return (false);
        }
    }

    return (true);
}